

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macThread.c
# Opt level: O2

void setUpMacParams(macParams *params,_Bool *mac_status,_Bool *running,_Bool *valid,
                   MacCtx_t *mac_context,pthread_mutex_t *in_mutex,pthread_mutex_t *out_mutex,
                   queue *in,queue *out,progress_t *progress,ThreefishKey_t *tf_key,int32_t *error,
                   uint64_t *file_size)

{
  params->mac_status = mac_status;
  params->running = running;
  params->valid = valid;
  params->mac_context = mac_context;
  params->in_mutex = in_mutex;
  params->out_mutex = out_mutex;
  params->in = in;
  params->out = out;
  params->progress = progress;
  params->tf_key = tf_key;
  params->error = error;
  params->file_size = file_size;
  return;
}

Assistant:

inline void setUpMacParams(macParams* params,
                           bool* mac_status,
                           bool* running,
                           bool* valid,
                           MacCtx_t* mac_context,
                           pthread_mutex_t* in_mutex,
                           pthread_mutex_t* out_mutex,
                           queue* in,
                           queue* out,
                           progress_t* progress,
                           ThreefishKey_t* tf_key,
                           int32_t* error,
                           uint64_t* file_size)
{
    params->mac_status = mac_status;
    params->running = running;
    params->valid = valid;
    params->mac_context = mac_context;
    params->in_mutex = in_mutex;
    params->out_mutex = out_mutex;
    params->in = in;
    params->out = out;
    params->progress = progress;
    params->tf_key = tf_key;
    params->error = error;
    params->file_size = file_size;
}